

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui.h
# Opt level: O0

void __thiscall ImTui::TScreen::resize(TScreen *this,int pnx,int pny)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  
  *in_RDI = in_ESI;
  in_RDI[1] = in_EDX;
  if (in_RDI[2] < *in_RDI * in_RDI[1]) {
    if ((*(long *)(in_RDI + 4) != 0) && (*(void **)(in_RDI + 4) != (void *)0x0)) {
      operator_delete__(*(void **)(in_RDI + 4));
    }
    in_RDI[2] = *in_RDI * in_RDI[1];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)in_RDI[2];
    uVar2 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pvVar3 = operator_new__(uVar2);
    *(void **)(in_RDI + 4) = pvVar3;
  }
  return;
}

Assistant:

inline void resize(int pnx, int pny) {
        nx = pnx;
        ny = pny;
        if (nx*ny <= nmax) return;

        if (data) delete [] data;

        nmax = nx*ny;
        data = new TCell[nmax];
    }